

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Clear
          (SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *this)

{
  Type pNVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  long extraout_RDX;
  code *local_60;
  SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  pNVar1 = this->allocator;
  ppSVar4 = SListNodeBase<Memory::NoCheckHeapAllocator>::Next
                      ((SListNodeBase<Memory::NoCheckHeapAllocator> *)this);
  next = *ppSVar4;
  while (bVar3 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::IsHead
                           (&this->
                             super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>
                            ,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::NoCheckHeapAllocator>::Next(next);
    pSVar2 = *ppSVar4;
    local_60 = (code *)Memory::TypeAllocatorFunc<Memory::NoCheckHeapAllocator,_Js::RangeUnit<int>_>
                       ::GetFreeFunc();
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *(long *)(pNVar1 + extraout_RDX) + -1);
    }
    (*local_60)(pNVar1 + extraout_RDX,next,0x10);
    next = pSVar2;
  }
  SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Reset
            (&this->super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>);
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }